

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

int __thiscall
UnifiedRegex::BeginLoopIfSetInst::Print
          (BeginLoopIfSetInst *this,DebugWriter *w,Label label,Char *litbuf)

{
  Char *litbuf_local;
  Label label_local;
  DebugWriter *w_local;
  BeginLoopIfSetInst *this_local;
  
  DebugWriter::Print(w,L"L%04x: ",(ulong)label);
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x43);
  }
  DebugWriter::Print(w,L"BeginLoopIfSet");
  DebugWriter::Print(w,L"(");
  SetMixin<false>::Print(&this->super_SetMixin<false>,w,litbuf);
  DebugWriter::Print(w,L", ");
  BeginLoopMixin::Print(&this->super_BeginLoopMixin,w,litbuf);
  DebugWriter::Print(w,L", ");
  BodyGroupsMixin::Print(&this->super_BodyGroupsMixin,w,litbuf);
  DebugWriter::PrintEOL(w,L")");
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::SetMixin<false>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_SetMixin<false>,L"SetMixin<false>"
              );
    Inst::PrintBytes<UnifiedRegex::BeginLoopMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_BeginLoopMixin,L"BeginLoopMixin");
    Inst::PrintBytes<UnifiedRegex::BodyGroupsMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_BodyGroupsMixin,L"BodyGroupsMixin"
              );
    DebugWriter::Unindent(w);
  }
  return 0x43;
}

Assistant:

int BeginLoopIfSetInst::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        PRINT_RE_BYTECODE_BEGIN("BeginLoopIfSet");
        PRINT_MIXIN_COMMA(SetMixin<false>);
        PRINT_MIXIN_COMMA(BeginLoopMixin);
        PRINT_MIXIN(BodyGroupsMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(SetMixin<false>);
        PRINT_BYTES(BeginLoopMixin);
        PRINT_BYTES(BodyGroupsMixin);
        PRINT_RE_BYTECODE_END();
    }